

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckCloseFailureContainsCorrectDetails::RunImpl
          (TestCheckCloseFailureContainsCorrectDetails *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_9d0 [2];
  TestDetails local_990 [2];
  TestDetails local_950 [2];
  TestDetails local_910 [2];
  TestDetails local_8d0;
  float local_8ac;
  float local_8a8;
  float local_8a4;
  undefined1 local_8a0 [8];
  ScopedCurrentTest scopedResults;
  TestDetails testDetails;
  undefined1 local_860 [8];
  TestResults testResults;
  RecordingReporter reporter;
  int line;
  TestCheckCloseFailureContainsCorrectDetails *this_local;
  
  reporter._2092_4_ = 0;
  RecordingReporter::RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_860,(TestReporter *)&testResults.m_failureCount);
  UnitTest::TestDetails::TestDetails
            ((TestDetails *)&scopedResults.m_oldTestDetails,"test","suite","filename",-1);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_8a0,(TestResults *)local_860,
             (TestDetails *)&scopedResults.m_oldTestDetails);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_8a4 = 1.0;
  local_8a8 = 1.1;
  local_8ac = 0.01;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8d0,*ppTVar3,0x10c);
  UnitTest::CheckClose<float,float,float>(pTVar1,&local_8a4,&local_8a8,&local_8ac,&local_8d0);
  reporter._2092_4_ = 0x10c;
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_8a0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_910,*ppTVar3,0x10f);
  UnitTest::CheckEqual(pTVar1,"test",reporter.lastFailedSuite + 0xf8,local_910);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_950,*ppTVar3,0x110);
  UnitTest::CheckEqual(pTVar1,"suite",reporter.lastFailedFile + 0xfc,local_950);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_990,*ppTVar3,0x111);
  UnitTest::CheckEqual(pTVar1,"filename",reporter.lastStartedTest + 0xfc,local_990);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_9d0,*ppTVar3,0x112);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&reporter.field_0x82c,(int *)(reporter.lastFailedFile + 0xf8),local_9d0);
  RecordingReporter::~RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  return;
}

Assistant:

TEST(CheckCloseFailureContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("test", "suite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		CHECK_CLOSE (1.0f, 1.1f, 0.01f);    line = __LINE__;
    }

    CHECK_EQUAL("test", reporter.lastFailedTest);
    CHECK_EQUAL("suite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}